

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

bool __thiscall QJpegHandler::supportsOption(QJpegHandler *this,ImageOption option)

{
  undefined1 local_d;
  ImageOption option_local;
  QJpegHandler *this_local;
  
  local_d = true;
  if ((((((option != Quality) && (local_d = true, option != ScaledSize)) &&
        (local_d = true, option != ScaledClipRect)) &&
       ((local_d = true, option != ClipRect && (local_d = true, option != Description)))) &&
      ((local_d = true, option != Size &&
       ((local_d = true, option != SubType && (local_d = true, option != SupportedSubTypes)))))) &&
     ((local_d = true, option != ImageFormat &&
      ((local_d = true, option != OptimizedWrite && (local_d = true, option != ProgressiveScanWrite)
       ))))) {
    local_d = option == ImageTransformation;
  }
  return local_d;
}

Assistant:

bool QJpegHandler::supportsOption(ImageOption option) const
{
    return option == Quality
        || option == ScaledSize
        || option == ScaledClipRect
        || option == ClipRect
        || option == Description
        || option == Size
        || option == SubType
        || option == SupportedSubTypes
        || option == ImageFormat
        || option == OptimizedWrite
        || option == ProgressiveScanWrite
        || option == ImageTransformation;
}